

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O0

void build_bitfield_ins(m68k_info *info,int opcode,int has_d_arg)

{
  uint uVar1;
  m68k_info *info_00;
  m68k_op_mem *op;
  int in_EDX;
  uint extension;
  cs_m68k *ext;
  cs_m68k_op *op1;
  cs_m68k_op *op_ea;
  uint8_t width;
  uint8_t offset;
  undefined8 in_stack_ffffffffffffffd0;
  undefined8 in_stack_ffffffffffffffd8;
  m68k_info *in_stack_ffffffffffffffe0;
  byte local_12;
  byte local_11;
  
  info_00 = (m68k_info *)
            build_init_op(in_stack_ffffffffffffffe0,(int)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
                          (int)in_stack_ffffffffffffffd8,
                          (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
  uVar1 = read_imm_16(info_00);
  op = &(info_00->extension).operands[0].mem;
  if ((uVar1 & 0x800) == 0) {
    local_11 = (byte)(uVar1 >> 6) & 0x1f;
  }
  else {
    local_11 = (byte)(uVar1 >> 6) & 7;
  }
  if ((uVar1 & 0x20) == 0) {
    local_12 = (byte)g_5bit_data_table[uVar1 & 0x1f];
  }
  else {
    local_12 = (byte)uVar1 & 7;
  }
  if (in_EDX != 0) {
    *(undefined1 *)&(info_00->extension).operands[3].mem.in_base_reg = M68K_REG_D1;
    (info_00->extension).operands[1].field_0.reg_pair.reg_1 = M68K_REG_D0;
    op->base_reg = (uVar1 >> 0xc & 7) + M68K_REG_D0;
  }
  get_ea_mode_op(info_00,(cs_m68k_op *)op,(uint)((ulong)info_00 >> 0x20),(uint)info_00);
  *(undefined1 *)((long)&info_00->inst + 7) = 1;
  *(byte *)&info_00->pc = local_12;
  *(byte *)((long)&info_00->pc + 1) = local_11;
  return;
}

Assistant:

static void build_bitfield_ins(m68k_info *info, int opcode, int has_d_arg)
{
	uint8_t offset;
	uint8_t width;
	cs_m68k_op* op_ea;
	cs_m68k_op* op1;
	cs_m68k* ext = build_init_op(info, opcode, 1, 0);
	uint extension = read_imm_16(info);

	op_ea = &ext->operands[0];
	op1 = &ext->operands[1];

	if (BIT_B(extension))
		offset = (extension >> 6) & 7;
	else
		offset = (extension >> 6) & 31;

	if (BIT_5(extension))
		width = extension & 7;
	else
		width = (uint8_t)g_5bit_data_table[extension & 31];

	if (has_d_arg) {
		ext->op_count = 2;
		op1->address_mode = M68K_AM_REG_DIRECT_DATA;
		op1->reg = M68K_REG_D0 + ((extension >> 12) & 7);
	}

	get_ea_mode_op(info, op_ea, info->ir, 1);

	op_ea->mem.bitfield = 1;
	op_ea->mem.width = width;
	op_ea->mem.offset = offset;
}